

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.cpp
# Opt level: O0

void __thiscall xe::ri::List::~List(List *this)

{
  bool bVar1;
  reference ppIVar2;
  __normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>
  local_20;
  __normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>
  local_18;
  iterator i;
  List *this_local;
  
  i._M_current = (Item **)this;
  local_18._M_current =
       (Item **)std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::begin(&this->m_items);
  while( true ) {
    local_20._M_current =
         (Item **)std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::end(&this->m_items);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>
              ::operator*(&local_18);
    if (*ppIVar2 != (Item *)0x0) {
      (*(*ppIVar2)->_vptr_Item[1])();
    }
    __gnu_cxx::
    __normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>
    ::operator++(&local_18,0);
  }
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::clear(&this->m_items);
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::~vector(&this->m_items);
  return;
}

Assistant:

List::~List (void)
{
	for (std::vector<Item*>::iterator i = m_items.begin(); i != m_items.end(); i++)
		delete *i;
	m_items.clear();
}